

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

size_t cookie_hash_domain(char *domain,size_t len)

{
  char cVar1;
  size_t j;
  size_t h;
  char *end;
  size_t len_local;
  char *domain_local;
  
  j = 0x1505;
  len_local = (size_t)domain;
  while (len_local < domain + len) {
    cVar1 = Curl_raw_toupper(*(char *)len_local);
    j = (long)cVar1 ^ j * 0x21;
    len_local = len_local + 1;
  }
  return j % 0x3f;
}

Assistant:

static size_t cookie_hash_domain(const char *domain, const size_t len)
{
  const char *end = domain + len;
  size_t h = 5381;

  while(domain < end) {
    size_t j = (size_t)Curl_raw_toupper(*domain++);
    h += h << 5;
    h ^= j;
  }

  return (h % COOKIE_HASH_SIZE);
}